

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::StringMaker<char[7],void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<char[7],void> *this,char *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  allocator<char> local_39;
  string local_38 [32];
  StringMaker<char[7],void> *local_18;
  char *str_local;
  
  local_18 = this;
  str_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,(char *)this,&local_39);
  Detail::stringify<std::__cxx11::string>(__return_storage_ptr__,(Detail *)local_38,e);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(char const* str) {
            return ::Catch::Detail::stringify(std::string{ str });
        }